

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifDsd.c
# Opt level: O3

void If_DsdManPrint_rec(FILE *pFile,If_DsdMan_t *p,int iDsdLit,uchar *pPermLits,int *pnSupp)

{
  int *piVar1;
  Vec_Mem_t *pVVar2;
  bool bVar3;
  byte bVar4;
  uint uVar5;
  uint uVar6;
  int iVar7;
  char *__s;
  ulong *puVar8;
  long lVar9;
  long lVar10;
  char *pcVar11;
  ulong *puVar12;
  ulong uVar13;
  long lVar14;
  
  if (iDsdLit < 0) {
    __assert_fail("Lit >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                  ,0x130,"int Abc_LitIsCompl(int)");
  }
  pcVar11 = "!";
  __s = "!";
  if ((iDsdLit & 1U) == 0) {
    __s = "";
  }
  fputs(__s,(FILE *)pFile);
  if ((p->vObjs).nSize <= (int)((uint)iDsdLit >> 1)) {
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                  ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
  }
  piVar1 = (int *)(p->vObjs).pArray[(uint)iDsdLit >> 1];
  uVar5 = piVar1[1];
  uVar6 = uVar5 & 7;
  if (uVar6 == 6) {
    if (uVar5 < 0x18000000) {
LAB_00420534:
      __assert_fail("i >= 0 && i < p->nEntries",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecMem.h"
                    ,0xc9,"word *Vec_MemReadEntry(Vec_Mem_t *, int)");
    }
    iVar7 = *piVar1;
    if (((long)iVar7 < 0) || ((p->vTruths).nSize <= iVar7)) {
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                    ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
    }
    uVar6 = (p->vTruths).pArray[iVar7];
    if (((int)uVar6 < 0) || (pVVar2 = p->vTtMem[uVar5 >> 0x1b], pVVar2->nEntries <= (int)uVar6))
    goto LAB_00420534;
    puVar8 = pVVar2->ppPages[uVar6 >> ((byte)pVVar2->LogPageSze & 0x1f)] +
             (long)(int)(pVVar2->PageMask & uVar6) * (long)pVVar2->nEntrySize;
    bVar4 = (byte)(uVar5 >> 0x18);
    uVar6 = 1 << ((bVar4 >> 3) - 6 & 0x1f);
    if (uVar5 < 0x38000000) {
      uVar6 = 1;
    }
    puVar12 = puVar8 + ((ulong)uVar6 - 1);
    uVar6 = 6;
    if (puVar8 <= puVar12) {
      uVar13 = 0xf;
      if (uVar5 < 0x30000000) {
        uVar13 = (ulong)(uint)~(-1 << ((bVar4 >> 3) - 2 & 0x1f));
      }
      lVar9 = uVar13 + 1;
      lVar14 = uVar13 << 2;
      do {
        uVar5 = (uint)(*puVar12 >> ((byte)lVar14 & 0x3c)) & 0xf;
        iVar7 = uVar5 + 0x30;
        if (9 < uVar5) {
          iVar7 = uVar5 + 0x37;
        }
        fputc(iVar7,(FILE *)pFile);
        lVar10 = lVar9 + -1;
        bVar3 = 0 < lVar9;
        lVar9 = lVar10;
        lVar14 = lVar14 + -4;
      } while ((lVar10 != 0 && bVar3) ||
              (puVar12 = puVar12 + -1, lVar9 = uVar13 + 1, lVar14 = uVar13 << 2, puVar8 <= puVar12))
      ;
      uVar6 = piVar1[1] & 7;
    }
  }
  else {
    if (uVar6 == 2) {
      iVar7 = *pnSupp;
      *pnSupp = iVar7 + 1;
      if (pPermLits == (uchar *)0x0) {
        if (iVar7 < 0) {
          __assert_fail("Var >= 0 && !(c >> 1)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                        ,0x12e,"int Abc_Var2Lit(int, int)");
        }
        uVar5 = iVar7 * 2;
      }
      else {
        uVar5 = (uint)pPermLits[iVar7];
      }
      if ((uVar5 & 1) == 0) {
        pcVar11 = "";
      }
      fprintf((FILE *)pFile,"%s%c",pcVar11,(ulong)((uVar5 >> 1) + 0x61));
      return;
    }
    if (uVar6 == 1) {
      iVar7 = 0x30;
      goto LAB_004204a1;
    }
  }
  fputc((int)(char)(&DAT_009bad80)[uVar6],(FILE *)pFile);
  uVar5 = piVar1[1];
  if ((0x7ffffff < uVar5) && (iVar7 = piVar1[2], iVar7 != 0)) {
    uVar13 = 1;
    do {
      If_DsdManPrint_rec(pFile,p,iVar7,pPermLits,pnSupp);
      uVar5 = piVar1[1];
      if (uVar5 >> 0x1b <= uVar13) break;
      iVar7 = piVar1[uVar13 + 2];
      uVar13 = uVar13 + 1;
    } while (iVar7 != 0);
  }
  iVar7 = (int)(char)(&DAT_009bad87)[uVar5 & 7];
LAB_004204a1:
  fputc(iVar7,(FILE *)pFile);
  return;
}

Assistant:

void If_DsdManPrint_rec( FILE * pFile, If_DsdMan_t * p, int iDsdLit, unsigned char * pPermLits, int * pnSupp )
{
    char OpenType[7]  = {0, 0, 0, '(', '[', '<', '{'};
    char CloseType[7] = {0, 0, 0, ')', ']', '>', '}'};
    If_DsdObj_t * pObj;
    int i, iFanin;
    fprintf( pFile, "%s", Abc_LitIsCompl(iDsdLit) ? "!" : ""  );
    pObj = If_DsdVecObj( &p->vObjs, Abc_Lit2Var(iDsdLit) );
    if ( If_DsdObjType(pObj) == IF_DSD_CONST0 )
        { fprintf( pFile, "0" ); return; }
    if ( If_DsdObjType(pObj) == IF_DSD_VAR )
    {
        int iPermLit = pPermLits ? (int)pPermLits[(*pnSupp)++] : Abc_Var2Lit((*pnSupp)++, 0);
        fprintf( pFile, "%s%c", Abc_LitIsCompl(iPermLit)? "!":"", 'a' + Abc_Lit2Var(iPermLit) );
        return;
    }
    if ( If_DsdObjType(pObj) == IF_DSD_PRIME )
        Abc_TtPrintHexRev( pFile, If_DsdObjTruth(p, pObj), If_DsdObjFaninNum(pObj) );
    fprintf( pFile, "%c", OpenType[If_DsdObjType(pObj)] );
    If_DsdObjForEachFaninLit( &p->vObjs, pObj, iFanin, i )
        If_DsdManPrint_rec( pFile, p, iFanin, pPermLits, pnSupp );
    fprintf( pFile, "%c", CloseType[If_DsdObjType(pObj)] );
}